

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcStatesStatesFixedScaling
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,int *child1States,double *child1TransMat,
          int *child2States,double *child2TransMat,double *scaleFactors,int startPattern,
          int endPattern)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  iVar2 = this->kPatternCount;
  uVar3 = this->kCategoryCount;
  iVar4 = this->kPartialsPaddedStateCount;
  for (uVar13 = 0; uVar13 != (~((int)uVar3 >> 0x1f) & uVar3); uVar13 = uVar13 + 1) {
    iVar5 = this->kMatrixSize;
    uVar6 = this->kStateCount;
    iVar14 = (iVar2 * uVar13 + startPattern) * iVar4;
    for (lVar15 = (long)startPattern; lVar15 < endPattern; lVar15 = lVar15 + 1) {
      iVar7 = child1States[lVar15];
      iVar8 = this->kTransPaddedStateCount;
      dVar1 = scaleFactors[lVar15];
      iVar9 = child2States[lVar15];
      lVar12 = (long)(int)(iVar5 * uVar13);
      for (lVar16 = 0; (~((int)uVar6 >> 0x1f) & uVar6) != (uint)lVar16; lVar16 = lVar16 + 1) {
        lVar10 = iVar7 + lVar12;
        lVar11 = iVar9 + lVar12;
        lVar12 = lVar12 + iVar8;
        destP[iVar14 + lVar16] = (child1TransMat[lVar10] * child2TransMat[lVar11]) / dVar1;
      }
      destP[iVar14 + lVar16] = 0.0;
      iVar14 = iVar14 + 1 + (uint)lVar16;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                     const int* child1States,
                                                                     const REALTYPE* child1TransMat,
                                                                     const int* child2States,
                                                                     const REALTYPE* child2TransMat,
                                                                     const REALTYPE* scaleFactors,
                                                                     int startPattern,
                                                                     int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
    int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = child1States[k];
            const int state2 = child2States[k];
            int w = l * kMatrixSize;
            REALTYPE scaleFactor = scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = child1TransMat[w + state1] *
                           child2TransMat[w + state2] / scaleFactor;
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}